

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

_Bool build_vault(chunk *c,loc_conflict centre,vault *v)

{
  byte bVar1;
  byte bVar2;
  _Bool _Var3;
  uint32_t uVar4;
  square *psVar5;
  ushort **ppuVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  wchar_t wVar10;
  int __c;
  long lVar12;
  uint uVar13;
  chunk *pcVar14;
  _Bool great;
  char *pcVar15;
  wchar_t wVar16;
  loc_conflict grid;
  _Bool reflect;
  wchar_t twid;
  wchar_t rotate;
  wchar_t thgt;
  char racial_symbol [30];
  loc local_c8;
  chunk *local_c0;
  _Bool local_b1;
  ulong local_b0;
  ulong local_a8;
  uint local_a0;
  wchar_t local_9c;
  char *local_98;
  loc_conflict local_90;
  uint local_84;
  ulong local_80;
  ulong local_78;
  char *local_70;
  bitflag *local_68;
  wchar_t local_60;
  wchar_t local_5c;
  byte local_58 [40];
  ulong uVar11;
  ulong uVar17;
  
  pcVar15 = v->text;
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0x19] = 0;
  local_58[0x1a] = 0;
  local_58[0x1b] = 0;
  local_58[0x1c] = 0;
  local_58[0x1d] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  local_90 = centre;
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                  ,0x566,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
  }
  event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,v->name);
  local_c0 = c;
  local_70 = pcVar15;
  if ((centre.y < c->height) && (centre.x < c->width)) {
    get_random_symmetry_transform
              ((uint)v->hgt,(uint)v->wid,L'\0',L'\0',&local_9c,&local_b1,(int *)&local_84,
               (int *)&local_a0);
    if ((local_84 != v->hgt) || (local_a0 != v->wid)) {
      __assert_fail("v->hgt == thgt && v->wid == twid",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                    ,0x576,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
    }
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,(uint)v->hgt + L'\x02',(uint)v->wid + L'\x02');
    local_90.y = centre.y;
  }
  else {
    bVar2 = v->hgt;
    bVar1 = v->wid;
    wVar10 = calc_default_transpose_weight((uint)bVar2,(uint)bVar1);
    get_random_symmetry_transform
              ((uint)bVar2,(uint)bVar1,L'\0',wVar10,&local_9c,&local_b1,(int *)&local_84,
               (int *)&local_a0);
    event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_84 + L'\x02',local_a0 + L'\x02');
    _Var3 = find_space(&local_90,local_84 + L'\x02',local_a0 + L'\x02');
    if (!_Var3) {
      return false;
    }
    centre = (loc_conflict)((ulong)local_90 & 0xffffffff);
    c = local_c0;
  }
  local_78 = (ulong)local_a0;
  wVar16 = centre.x - (int)local_a0 / 2;
  uVar17 = (ulong)(uint)wVar16;
  local_80 = (ulong)local_84;
  wVar10 = local_90.y - (int)local_84 / 2;
  uVar11 = (ulong)(uint)wVar10;
  local_90.y = wVar10;
  local_90.x = wVar16;
  local_5c = local_84 + wVar10 + L'\xffffffff';
  local_60 = wVar16 + L'\xffffffff' + local_a0;
  generate_mark(c,wVar10,wVar16,local_5c,local_60,L'\x0e');
  bVar2 = v->hgt;
  if (bVar2 != 0) {
    local_80 = (ulong)(uint)((int)local_80 + wVar10);
    local_78 = (ulong)(uint)((int)local_78 + wVar16);
    local_68 = v->flags;
    uVar13 = 0;
    pcVar15 = local_70;
    local_b0 = uVar11;
    local_a8 = uVar17;
    do {
      if (*pcVar15 == '\0') break;
      if (v->wid != '\0') {
        lVar12 = 0;
        pcVar14 = local_c0;
        local_98 = pcVar15;
        do {
          if (pcVar15[lVar12] == '\0') break;
          local_c8 = (loc)loc((int)lVar12,uVar13);
          symmetry_transform((loc_conflict *)&local_c8,(wchar_t)local_b0,(wchar_t)uVar17,
                             (uint)v->hgt,(uint)v->wid,local_9c,local_b1);
          if ((local_c8.x < (wchar_t)uVar17) || ((wchar_t)local_78 <= local_c8.x)) {
LAB_001505df:
            __assert_fail("grid.x >= x1 && grid.x <= x2 && grid.y >= y1 && grid.y <= y2",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                          ,0x590,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
          }
          if ((local_c8.y < (wchar_t)local_b0) || ((wchar_t)local_80 <= local_c8.y))
          goto LAB_001505df;
          if (pcVar15[lVar12] == ' ') goto LAB_0014fe80;
          square_set_feat((chunk_conflict *)pcVar14,local_c8,L'\x01');
          _Var3 = square_isempty((chunk_conflict *)pcVar14,local_c8);
          if (!_Var3) {
            __assert_fail("square_isempty(c, grid)",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                          ,0x599,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
          }
          bVar2 = pcVar15[lVar12];
          if (bVar2 < 0x3a) {
            wVar16 = local_c8.x;
            wVar10 = local_c8.y;
            switch(bVar2) {
            case 0x23:
              square_set_feat((chunk_conflict *)local_c0,local_c8,L'\x15');
              pcVar14 = local_c0;
              generate_mark(local_c0,wVar10,wVar16,wVar10,wVar16,L'\r');
              break;
            case 0x25:
              square_set_feat((chunk_conflict *)pcVar14,local_c8,L'\x15');
              generate_mark(pcVar14,wVar10,wVar16,wVar10,wVar16,L'\f');
              _Var3 = flag_has_dbg(local_68,1,1,"v->flags","ROOMF_FEW_ENTRANCES");
              if (_Var3) {
                append_entrance((loc_conflict)local_c8);
              }
              pcVar14 = local_c0;
              psVar5 = square((chunk_conflict *)local_c0,local_c8);
              flag_on_dbg(psVar5->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
              uVar17 = local_a8;
              goto LAB_0014fe80;
            case 0x26:
              uVar4 = Rand_div(100);
              if (0x4a < (int)uVar4) goto LAB_0014fd2d;
              place_object((chunk_conflict *)pcVar14,(loc_conflict)local_c8,pcVar14->depth,false,
                           false,'\x05',L'\0');
              break;
            case 0x2a:
              uVar4 = Rand_div(2);
              wVar10 = L'\x14' - (uint)(uVar4 == 0);
              goto LAB_0014fe09;
            case 0x2b:
              place_secret_door((chunk_conflict *)pcVar14,(loc_conflict)local_c8);
            }
            goto switchD_0014fba5_caseD_3b;
          }
          switch(bVar2) {
          case 0x3a:
            uVar4 = Rand_div(2);
            wVar10 = (uint)(uVar4 == 0) * 8 + L'\x10';
            goto LAB_0014fe09;
          case 0x3b:
          case 0x3d:
          case 0x3f:
            break;
          case 0x3c:
            if (dun->persist == false) {
LAB_0014fdfc:
              wVar10 = L'\x05';
              goto LAB_0014fe09;
            }
            break;
          case 0x3e:
            if (dun->persist == false) {
              if ((dun->quest != false) ||
                 ((uint)z_info->max_depth + L'\xffffffff' <= pcVar14->depth)) goto LAB_0014fdfc;
              wVar10 = L'\x06';
              goto LAB_0014fe09;
            }
            break;
          case 0x40:
            wVar10 = L'\x16';
LAB_0014fe09:
            square_set_feat((chunk_conflict *)pcVar14,local_c8,wVar10);
            break;
          default:
            if (bVar2 == 0x5e) {
LAB_0014fd2d:
              uVar4 = Rand_div(4);
              if (uVar4 == 0) {
                place_trap(pcVar14,local_c8,L'\xffffffff',pcVar14->depth);
              }
            }
            else if (bVar2 == 0x60) {
              wVar10 = L'\x17';
              goto LAB_0014fe09;
            }
          }
switchD_0014fba5_caseD_3b:
          psVar5 = square((chunk_conflict *)pcVar14,local_c8);
          flag_on_dbg(psVar5->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
          psVar5 = square((chunk_conflict *)pcVar14,local_c8);
          pcVar15 = local_98;
          flag_on_dbg(psVar5->info,3,3,"square(c, grid)->info","SQUARE_VAULT");
LAB_0014fe80:
          lVar12 = lVar12 + 1;
        } while ((uint)lVar12 < (uint)v->wid);
        pcVar15 = pcVar15 + lVar12;
        bVar2 = v->hgt;
        uVar11 = local_b0;
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < bVar2);
    wVar10 = (wchar_t)uVar11;
    wVar16 = (wchar_t)uVar17;
    if (bVar2 != 0) {
      iVar9 = 0;
      local_98 = (char *)((ulong)local_98 & 0xffffffff00000000);
      pcVar15 = local_70;
      do {
        wVar10 = (wchar_t)uVar11;
        wVar16 = (wchar_t)uVar17;
        if (*pcVar15 == '\0') break;
        if (v->wid != '\0') {
          lVar12 = 0;
          do {
            if (pcVar15[lVar12] == '\0') break;
            local_c8 = (loc)loc((int)lVar12,(int)local_98);
            symmetry_transform((loc_conflict *)&local_c8,(wchar_t)uVar11,(wchar_t)uVar17,
                               (uint)v->hgt,(uint)v->wid,local_9c,local_b1);
            if ((((local_c8.x < (wchar_t)uVar17) || ((wchar_t)local_78 <= local_c8.x)) ||
                (local_c8.y < (wchar_t)uVar11)) || ((wchar_t)local_80 <= local_c8.y)) {
              __assert_fail("grid.x >= x1 && grid.x <= x2 && grid.y >= y1 && grid.y <= y2",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                            ,0x5f1,"_Bool build_vault(struct chunk *, struct loc, struct vault *)");
            }
            bVar2 = pcVar15[lVar12];
            __c = (int)(char)bVar2;
            uVar11 = local_b0;
            if (__c == 0x20) goto switchD_0014ffe8_caseD_25;
            ppuVar6 = __ctype_b_loc();
            uVar11 = local_b0;
            pcVar14 = local_c0;
            if (((bVar2 & 0xdf) != 0x58) && (((*ppuVar6)[__c] & 0x400) != 0)) {
              pcVar7 = strchr((char *)local_58,__c);
              uVar11 = local_b0;
              if (iVar9 < 0x1e && pcVar7 == (char *)0x0) {
                lVar8 = (long)iVar9;
                iVar9 = iVar9 + 1;
                local_58[lVar8] = bVar2;
              }
              goto switchD_0014ffe8_caseD_25;
            }
            if (0x5c < bVar2) {
              if (bVar2 < 0x7c) {
                if (bVar2 != 0x5d) {
                  if (bVar2 == 0x5f) {
                    wVar16 = local_c0->depth + L'\x03';
                    uVar4 = Rand_div(4);
                    _Var3 = uVar4 == 0;
                    wVar10 = L'\x16';
                    uVar11 = local_b0;
                    uVar17 = local_a8;
                    goto LAB_00150518;
                  }
                  goto switchD_0014ffe8_caseD_25;
                }
                uVar4 = Rand_div(3);
                uVar4 = Rand_div((uVar4 == 0) + 8);
                wVar10 = uVar4 + L'\n';
                if (8 < uVar4) {
                  wVar10 = L'\0';
                }
LAB_00150500:
                wVar16 = local_c0->depth + L'\x03';
                pcVar14 = local_c0;
                goto LAB_00150513;
              }
              if (bVar2 == 0x7c) {
                uVar4 = Rand_div(4);
                wVar10 = L'\0';
                if (uVar4 < 4) {
                  wVar10 = *(wchar_t *)(&DAT_002635d4 + (ulong)uVar4 * 4);
                }
                goto LAB_00150500;
              }
              if (bVar2 != 0x7e) goto switchD_0014ffe8_caseD_25;
              wVar16 = local_c0->depth + L'\x05';
              wVar10 = L'\x01';
              goto LAB_001503dd;
            }
            switch(bVar2) {
            case 0x21:
              wVar16 = local_c0->depth + L'\x03';
              uVar4 = Rand_div(4);
              _Var3 = uVar4 == 0;
              wVar10 = L'\x1a';
              uVar11 = local_b0;
              uVar17 = local_a8;
              break;
            case 0x22:
              wVar16 = local_c0->depth + L'\x03';
              uVar4 = Rand_div(4);
              _Var3 = uVar4 == 0;
              wVar10 = L'\x14';
              uVar11 = local_b0;
              uVar17 = local_a8;
              break;
            case 0x23:
              _Var3 = square_isroom((chunk_conflict *)local_c0,local_c8);
              if (((!_Var3) || (_Var3 = square_isvault((chunk_conflict *)pcVar14,local_c8), !_Var3))
                 || (_Var3 = square_isgranite((chunk_conflict *)pcVar14,local_c8), !_Var3)) {
LAB_0015063c:
                __assert_fail("square_isroom(c, grid) && square_isvault(c, grid) && square_isgranite(c, grid) && sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                              ,0x681,"_Bool build_vault(struct chunk *, struct loc, struct vault *)"
                             );
              }
              psVar5 = square((chunk_conflict *)pcVar14,local_c8);
              _Var3 = flag_has_dbg(psVar5->info,3,0xd,"square(c, grid)->info","SQUARE_WALL_SOLID");
              if (!_Var3) goto LAB_0015063c;
              wVar10 = count_neighbors((loc *)0x0,(chunk_conflict *)pcVar14,local_c8,square_isroom,
                                       false);
              uVar11 = local_b0;
              if (wVar10 == L'\b') {
                psVar5 = square((chunk_conflict *)pcVar14,local_c8);
                flag_off(psVar5->info,3,0xd);
                goto LAB_00150386;
              }
              goto switchD_0014ffe8_caseD_25;
            case 0x24:
              place_gold((chunk_conflict *)local_c0,(loc_conflict)local_c8,local_c0->depth,'\x05');
            default:
              goto switchD_0014ffe8_caseD_25;
            case 0x2c:
              wVar16 = local_c0->depth + L'\x03';
              uVar4 = Rand_div(4);
              _Var3 = uVar4 == 0;
              wVar10 = L'\x1c';
              uVar11 = local_b0;
              uVar17 = local_a8;
              break;
            case 0x2d:
              local_68 = (bitflag *)CONCAT44(local_68._4_4_,local_c0->depth + L'\x03');
              uVar4 = Rand_div(4);
              _Var3 = uVar4 == 0;
              uVar4 = Rand_div(2);
              wVar10 = L'\x18' - (uint)(uVar4 == 0);
              uVar11 = local_b0;
              uVar17 = local_a8;
              wVar16 = (wchar_t)local_68;
              break;
            case 0x30:
              wVar10 = local_c0->depth + L'\x14';
              goto LAB_00150533;
            case 0x31:
              uVar4 = Rand_div(2);
              if (uVar4 == 0) {
                wVar10 = local_c0->depth;
                goto LAB_00150533;
              }
              uVar4 = Rand_div(2);
              pcVar14 = local_c0;
              if (uVar4 == 0) {
                wVar16 = local_c0->depth;
                uVar4 = Rand_div(8);
                _Var3 = uVar4 == 0;
                wVar10 = L'\0';
                uVar11 = local_b0;
                uVar17 = local_a8;
                break;
              }
              uVar4 = Rand_div(4);
              if (uVar4 == 0) {
                place_trap(local_c0,local_c8,L'\xffffffff',local_c0->depth);
              }
              goto switchD_0014ffe8_caseD_25;
            case 0x32:
              wVar10 = local_c0->depth + L'\x05';
              goto LAB_00150533;
            case 0x33:
              wVar16 = local_c0->depth + L'\x03';
              goto LAB_001503d1;
            case 0x34:
              uVar4 = Rand_div(2);
              if (uVar4 == 0) {
                pick_and_place_monster
                          (local_c0,(loc_conflict)local_c8,local_c0->depth + L'\x03',true,true,'\r')
                ;
              }
              uVar4 = Rand_div(2);
              if (uVar4 == 0) goto switchD_0014ffe8_caseD_35;
              goto switchD_0014ffe8_caseD_25;
            case 0x35:
switchD_0014ffe8_caseD_35:
              wVar16 = local_c0->depth + L'\a';
              goto LAB_001503d1;
            case 0x36:
              wVar10 = local_c0->depth + L'\v';
LAB_00150533:
              pick_and_place_monster(local_c0,(loc_conflict)local_c8,wVar10,true,true,'\r');
              goto switchD_0014ffe8_caseD_25;
            case 0x37:
              wVar16 = local_c0->depth + L'\x0f';
LAB_001503d1:
              wVar10 = L'\0';
LAB_001503dd:
              _Var3 = false;
              pcVar14 = local_c0;
              break;
            case 0x38:
              pick_and_place_monster
                        (local_c0,(loc_conflict)local_c8,local_c0->depth + L'(',true,true,'\r');
              wVar16 = pcVar14->depth + L'\x14';
              wVar10 = L'\0';
              _Var3 = true;
              great = true;
              uVar11 = local_b0;
              goto LAB_0015051b;
            case 0x39:
              pick_and_place_monster
                        (local_c0,(loc_conflict)local_c8,local_c0->depth + L'\t',true,true,'\r');
              wVar16 = pcVar14->depth + L'\a';
              wVar10 = L'\0';
              uVar11 = local_b0;
LAB_00150513:
              _Var3 = true;
              break;
            case 0x3d:
              wVar16 = local_c0->depth + L'\x03';
              uVar4 = Rand_div(4);
              _Var3 = uVar4 == 0;
              wVar10 = L'\x15';
              uVar11 = local_b0;
              uVar17 = local_a8;
              break;
            case 0x3f:
              wVar16 = local_c0->depth + L'\x03';
              uVar4 = Rand_div(4);
              _Var3 = uVar4 == 0;
              wVar10 = L'\x19';
              uVar11 = local_b0;
              uVar17 = local_a8;
              break;
            case 0x40:
              _Var3 = square_isroom((chunk_conflict *)local_c0,local_c8);
              if (((!_Var3) || (_Var3 = square_isvault((chunk_conflict *)pcVar14,local_c8), !_Var3))
                 || (_Var3 = square_isperm((chunk_conflict *)pcVar14,local_c8), !_Var3)) {
                __assert_fail("square_isroom(c, grid) && square_isvault(c, grid) && square_isperm(c, grid)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/gen-room.c"
                              ,0x695,"_Bool build_vault(struct chunk *, struct loc, struct vault *)"
                             );
              }
              wVar10 = count_neighbors((loc *)0x0,(chunk_conflict *)pcVar14,local_c8,square_isroom,
                                       false);
              uVar11 = local_b0;
              if (wVar10 == L'\b') {
LAB_00150386:
                psVar5 = square((chunk_conflict *)pcVar14,local_c8);
                flag_on_dbg(psVar5->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
                uVar11 = local_b0;
              }
              goto switchD_0014ffe8_caseD_25;
            }
LAB_00150518:
            great = false;
LAB_0015051b:
            place_object((chunk_conflict *)pcVar14,(loc_conflict)local_c8,wVar16,_Var3,great,'\x05',
                         wVar10);
switchD_0014ffe8_caseD_25:
            lVar12 = lVar12 + 1;
          } while ((uint)lVar12 < (uint)v->wid);
          pcVar15 = pcVar15 + lVar12;
          bVar2 = v->hgt;
        }
        wVar10 = (wchar_t)uVar11;
        wVar16 = (wchar_t)uVar17;
        uVar13 = (int)local_98 + 1;
        local_98 = (char *)CONCAT44(local_98._4_4_,uVar13);
      } while (uVar13 < bVar2);
    }
  }
  get_vault_monsters(local_c0,(char *)local_58,v->typ,local_70,wVar10,local_5c,wVar16,local_60);
  return true;
}

Assistant:

bool build_vault(struct chunk *c, struct loc centre, struct vault *v)
{
	const char *data = v->text;
	int y1, x1, y2, x2;
	int x, y, races_local = 0;
	const char *t;
	char racial_symbol[30] = "";
	bool icky;
	int rotate, thgt, twid;
	bool reflect;

	assert(c);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, v->name);
	if ((centre.y >= c->height) || (centre.x >= c->width)) {
		get_random_symmetry_transform(v->hgt, v->wid, SYMTR_FLAG_NONE,
			calc_default_transpose_weight(v->hgt, v->wid),
			&rotate, &reflect, &thgt, &twid);
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			thgt + 2, twid + 2);
		if (!find_space(&centre, thgt + 2, twid + 2))
			return (false);
	} else {
		/* Given the preset centre, don't allow transposition. */
		get_random_symmetry_transform(v->hgt, v->wid, SYMTR_FLAG_NONE,
			0, &rotate, &reflect, &thgt, &twid);
		assert(v->hgt == thgt && v->wid == twid);
		event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,
			thgt + 2, twid + 2);
	}

	/* Convert centre to translation for the symmetry transformation. */
	centre.x -= twid / 2;
	centre.y -= thgt / 2;

	/* Get the room corners */
	y1 = centre.y;
	x1 = centre.x;
	y2 = y1 + thgt - 1;
	x2 = x1 + twid - 1;

	/* No random monsters in vaults. */
	generate_mark(c, y1, x1, y2, x2, SQUARE_MON_RESTRICT);

	/* Place dungeon features and objects */
	for (t = data, y = 0; y < v->hgt && *t; y++) {
		for (x = 0; x < v->wid && *t; x++, t++) {
			struct loc grid = loc(x, y);

			symmetry_transform(&grid, centre.y, centre.x, v->hgt,
				v->wid, rotate, reflect);
			assert(grid.x >= x1 && grid.x <= x2 &&
				grid.y >= y1 && grid.y <= y2);

			/* Skip non-grids */
			if (*t == ' ') continue;

			/* Lay down a floor */
			square_set_feat(c, grid, FEAT_FLOOR);

			/* Debugging assertion */
			assert(square_isempty(c, grid));

			/* By default vault squares are marked icky */
			icky = true;

			/* Analyze the grid */
			switch (*t) {
			case '%': {
				/* In this case, the square isn't really part
				 * of the vault, but rather is part of the
				 * "door step" to the vault. We don't mark it
				 * icky so that the tunneling code knows it's
				 * allowed to remove this wall. */
				set_marked_granite(c, grid, SQUARE_WALL_OUTER);
				if (roomf_has(v->flags, ROOMF_FEW_ENTRANCES)) {
					append_entrance(grid);
				}
				icky = false;
				break;
			}
				/* Inner or non-tunnelable outside granite wall */
			case '#': set_marked_granite(c, grid, SQUARE_WALL_SOLID); break;
				/* Permanent wall */
			case '@': square_set_feat(c, grid, FEAT_PERM); break;
				/* Gold seam */
			case '*': {
				square_set_feat(c, grid, one_in_(2) ? FEAT_MAGMA_K :
								FEAT_QUARTZ_K);
				break;
			}
				/* Rubble */
			case ':': {
				square_set_feat(c, grid, one_in_(2) ? FEAT_PASS_RUBBLE :
								FEAT_RUBBLE);
				break;
			}
				/* Secret door */
			case '+': place_secret_door(c, grid); break;
				/* Trap */
			case '^': if (one_in_(4)) place_trap(c, grid, -1, c->depth); break;
				/* Treasure or a trap */
			case '&': {
				if (randint0(100) < 75) {
					place_object(c, grid, c->depth, false, false, ORIGIN_VAULT,
								 0);
				} else if (one_in_(4)) {
					place_trap(c, grid, -1, c->depth);
				}
				break;
			}
				/* Stairs */
			case '<': {
				if (dun->persist) break;
				square_set_feat(c, grid, FEAT_LESS); break;
			}
			case '>': {
				if (dun->persist) break;
				/* No down stairs at bottom or on quests */
				if (dun->quest || c->depth
						>= z_info->max_depth - 1) {
					square_set_feat(c, grid, FEAT_LESS);
				} else {
					square_set_feat(c, grid, FEAT_MORE);
				}
				break;
			}
				/* Lava */
			case '`': square_set_feat(c, grid, FEAT_LAVA); break;
				/* Included to allow simple inclusion of FA vaults */
			case '/': /*square_set_feat(c, grid, FEAT_WATER)*/; break;
			case ';': /*square_set_feat(c, grid, FEAT_TREE)*/; break;
			}

			/* Part of a vault */
			sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
			if (icky) sqinfo_on(square(c, grid)->info, SQUARE_VAULT);
		}
	}


	/* Place regular dungeon monsters and objects, convert inner walls */
	for (t = data, y = 0; y < v->hgt && *t; y++) {
		for (x = 0; x < v->wid && *t; x++, t++) {
			struct loc grid = loc(x, y);

			symmetry_transform(&grid, centre.y, centre.x, v->hgt,
				v->wid, rotate, reflect);
			assert(grid.x >= x1 && grid.x <= x2 &&
				grid.y >= y1 && grid.y <= y2);

			/* Hack -- skip "non-grids" */
			if (*t == ' ') continue;

			/* Most alphabetic characters signify monster races. */
			if (isalpha(*t) && (*t != 'x') && (*t != 'X')) {
				/* If the symbol is not yet stored, ... */
				if (!strchr(racial_symbol, *t)) {
					/* ... store it for later processing. */
					if (races_local < 30)
						racial_symbol[races_local++] = *t;
				}
			}

			/* Otherwise, analyze the symbol */
			else
				switch (*t) {
					/* An ordinary monster, object (sometimes good), or trap. */
				case '1': {
					if (one_in_(2)) {
						pick_and_place_monster(c, grid, c->depth , true, true,
											   ORIGIN_DROP_VAULT);
					} else if (one_in_(2)) {
						place_object(c, grid, c->depth,
									 one_in_(8) ? true : false, false,
									 ORIGIN_VAULT, 0);
					} else if (one_in_(4)) {
						place_trap(c, grid, -1, c->depth);
					}
					break;
				}
					/* Slightly out of depth monster. */
				case '2': pick_and_place_monster(c, grid, c->depth + 5, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Slightly out of depth object. */
				case '3': place_object(c, grid, c->depth + 3, false, false, 
									   ORIGIN_VAULT, 0); break;
					/* Monster and/or object */
				case '4': {
					if (one_in_(2))
						pick_and_place_monster(c, grid, c->depth + 3, true, 
											   true, ORIGIN_DROP_VAULT);
					if (one_in_(2))
						place_object(c, grid, c->depth + 7, false, false,
									 ORIGIN_VAULT, 0);
					break;
				}
					/* Out of depth object. */
				case '5': place_object(c, grid, c->depth + 7, false, false,
									   ORIGIN_VAULT, 0); break;
					/* Out of depth monster. */
				case '6': pick_and_place_monster(c, grid, c->depth + 11, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Very out of depth object. */
				case '7': place_object(c, grid, c->depth + 15, false, false,
									   ORIGIN_VAULT, 0); break;
					/* Very out of depth monster. */
				case '0': pick_and_place_monster(c, grid, c->depth + 20, true,
												 true, ORIGIN_DROP_VAULT);
					break;
					/* Meaner monster, plus treasure */
				case '9': {
					pick_and_place_monster(c, grid, c->depth + 9, true, true,
										   ORIGIN_DROP_VAULT);
					place_object(c, grid, c->depth + 7, true, false,
								 ORIGIN_VAULT, 0);
					break;
				}
					/* Nasty monster and treasure */
				case '8': {
					pick_and_place_monster(c, grid, c->depth + 40, true, true,
										   ORIGIN_DROP_VAULT);
					place_object(c, grid, c->depth + 20, true, true,
								 ORIGIN_VAULT, 0);
					break;
				}
					/* A chest. */
				case '~': place_object(c, grid, c->depth + 5, false, false,
									   ORIGIN_VAULT, TV_CHEST); break;
					/* Treasure. */
				case '$': place_gold(c, grid, c->depth, ORIGIN_VAULT);break;
					/* Armour. */
				case ']': {
					int	tval = 0, temp = one_in_(3) ? randint1(9) : randint1(8);
					switch (temp) {
					case 1: tval = TV_BOOTS; break;
					case 2: tval = TV_GLOVES; break;
					case 3: tval = TV_HELM; break;
					case 4: tval = TV_CROWN; break;
					case 5: tval = TV_SHIELD; break;
					case 6: tval = TV_CLOAK; break;
					case 7: tval = TV_SOFT_ARMOR; break;
					case 8: tval = TV_HARD_ARMOR; break;
					case 9: tval = TV_DRAG_ARMOR; break;
					}
					place_object(c, grid, c->depth + 3, true, false,
								 ORIGIN_VAULT, tval);
					break;
				}
					/* Weapon. */
				case '|': {
					int	tval = 0, temp = randint1(4);
					switch (temp) {
					case 1: tval = TV_SWORD; break;
					case 2: tval = TV_POLEARM; break;
					case 3: tval = TV_HAFTED; break;
					case 4: tval = TV_BOW; break;
					}
					place_object(c, grid, c->depth + 3, true, false,
								 ORIGIN_VAULT, tval);
					break;
				}
					/* Ring. */
				case '=': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_RING); break;
					/* Amulet. */
				case '"': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_AMULET); break;
					/* Potion. */
				case '!': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_POTION); break;
					/* Scroll. */
				case '?': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_SCROLL); break;
					/* Staff. */
				case '_': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_STAFF); break;
					/* Wand or rod. */
				case '-': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT,
									   one_in_(2) ? TV_WAND : TV_ROD);
					break;
					/* Food or mushroom. */
				case ',': place_object(c, grid, c->depth + 3, one_in_(4), false,
									   ORIGIN_VAULT, TV_FOOD); break;
					/* Inner or non-tunnelable outside granite wall */
				case '#': {
					/* Check consistency with first pass. */
					assert(square_isroom(c, grid) &&
						square_isvault(c, grid) &&
						square_isgranite(c, grid) &&
						sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID));
					/*
					 * Convert to SQUARE_WALL_INNER if it
					 * does not touch the outside of the
					 * vault.
					 */
					if (count_neighbors(NULL, c, grid,
							square_isroom, false) == 8) {
						sqinfo_off(square(c, grid)->info,
							SQUARE_WALL_SOLID);
						sqinfo_on(square(c, grid)->info,
							SQUARE_WALL_INNER);
					}
					break;
				}
					/* Permanent wall */
				case '@': {
					/* Check consistency with first pass. */
					assert(square_isroom(c, grid) &&
						square_isvault(c, grid) &&
						square_isperm(c, grid));
					/*
					 * Mark as SQUARE_WALL_INNER if it does
					 * not touch the outside of the vault.
					 */
					if (count_neighbors(NULL, c, grid,
							square_isroom, false) == 8) {
						sqinfo_on(square(c, grid)->info,
							SQUARE_WALL_INNER);
					}
					break;
				}
				}
		}
	}

	/* Place specified monsters */
	get_vault_monsters(c, racial_symbol, v->typ, data, y1, y2, x1, x2);

	return true;
}